

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O0

_Bool have_always_expectation_for(char *function)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  RecordedExpectation *expectation_00;
  char *in_RDI;
  RecordedExpectation *expectation;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    iVar3 = local_14;
    iVar2 = cgreen_vector_size(global_expectation_queue);
    if (iVar2 <= iVar3) {
      return false;
    }
    expectation_00 =
         (RecordedExpectation *)
         cgreen_vector_get((CgreenVector *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),0);
    iVar3 = strcmp(expectation_00->function,in_RDI);
    if ((iVar3 == 0) && (_Var1 = is_always_call(expectation_00), _Var1)) break;
    local_14 = local_14 + 1;
  }
  return true;
}

Assistant:

static bool have_always_expectation_for(const char* function) {
    for (int i = 0; i < cgreen_vector_size(global_expectation_queue); i++) {
        RecordedExpectation *expectation =
                (RecordedExpectation *)cgreen_vector_get(global_expectation_queue, i);
        if (strcmp(expectation->function, function) == 0) {
            if (is_always_call(expectation)) {
                return true;
            }
        }
    }

    return false;
}